

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O2

void __thiscall
LongReadsRecruiter::simple_thread_reads(LongReadsRecruiter *this,int min_count,int min_bp)

{
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  pointer pPVar5;
  int64_t iVar6;
  uint64_t uVar7;
  pointer ppVar8;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> *matches;
  long lVar9;
  int64_t pstart;
  LongReadsRecruiter *local_70;
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *local_68;
  long local_60;
  pointer local_58;
  int64_t pend;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  this_00 = &this->read_threads;
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::clear(this_00);
  local_68 = this_00;
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::resize(this_00,((long)(this->read_perfect_matches).
                          super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->read_perfect_matches).
                         super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_70 = (LongReadsRecruiter *)0x1;
  while( true ) {
    pvVar4 = (this->read_perfect_matches).
             super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((LongReadsRecruiter *)
        (((long)(this->read_perfect_matches).
                super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= local_70)
    break;
    local_60 = (long)local_70 * 0x18;
    matches = pvVar4 + (long)local_70;
    find_all_valid_blocks
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48,
               local_70,matches,min_count,min_bp);
    local_58 = local_48._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = 0;
    for (ppVar8 = local_48._M_impl.super__Vector_impl_data._M_start; ppVar8 != local_58;
        ppVar8 = ppVar8 + 1) {
      iVar1 = ppVar8->first;
      iVar2 = ppVar8->second;
      pPVar5 = (matches->super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = lVar9 + ((long)pPVar5[iVar1].read_position - (long)pPVar5[iVar1].node_position);
      pstart = lVar9;
      uVar7 = SequenceDistanceGraph::get_node_size(this->sdg,pPVar5[iVar1].node);
      iVar6 = pstart;
      pend = uVar7 + lVar9;
      pPVar5 = (matches->super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = pPVar5[iVar2].node_position;
      iVar2 = pPVar5[iVar2].read_position;
      std::vector<NodePosition,std::allocator<NodePosition>>::emplace_back<long_const&,long&,long&>
                ((vector<NodePosition,std::allocator<NodePosition>> *)
                 ((long)&(((local_68->
                           super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                         super__Vector_impl_data + local_60),&pPVar5[iVar1].node,&pstart,&pend);
      lVar9 = (iVar6 + iVar3) - (long)iVar2;
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&local_48);
    local_70 = (LongReadsRecruiter *)((long)&local_70->sdg + 1);
  }
  return;
}

Assistant:

void LongReadsRecruiter::simple_thread_reads(int min_count,int min_bp) {
    read_threads.clear();
    read_threads.resize(read_perfect_matches.size());
    for (auto rid=1;rid<read_perfect_matches.size();++rid){
        int64_t thread_offset=0;//offset between thread and read, computed on last block's position vs. its last match
        const auto & matches=read_perfect_matches[rid];
        for (auto nb:find_all_valid_blocks(matches,min_count,min_bp)) {
            int64_t pstart=matches[nb.first].read_position-matches[nb.first].node_position+thread_offset;
            int64_t pend=pstart+sdg.get_node_size(matches[nb.first].node);
            thread_offset=pstart+matches[nb.second].node_position-matches[nb.second].read_position;
            read_threads[rid].emplace_back(matches[nb.first].node, pstart, pend);
        }
    }
}